

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  curl_slist *headers;
  undefined8 uVar4;
  CURLM *cm;
  long lVar5;
  char buffer [246];
  undefined1 auStack_128 [248];
  
  eh[0] = (CURL *)0x0;
  eh[1] = (CURL *)0x0;
  tv_test_start = tutil_tvnow();
  iVar3 = 99;
  if (3 < test_argc) {
    curl_msnprintf(auStack_128,0xf6,"Host: %s",test_argv[4]);
    headers = (curl_slist *)curl_slist_append(0,auStack_128);
    if (headers == (curl_slist *)0x0) {
      curl_mfprintf(_stderr,"curl_slist_append() failed\n");
      iVar3 = 0x7e;
    }
    else {
      iVar2 = curl_global_init();
      uVar1 = _stderr;
      iVar3 = 0;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                      ,0xd2,iVar2,uVar4);
        iVar3 = iVar2;
      }
      if (iVar3 == 0) {
        cm = (CURLM *)curl_multi_init();
        if (cm == (CURLM *)0x0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                        ,0xd8);
          iVar3 = 0x7b;
        }
        else {
          iVar3 = loop(0,cm,URL,libtest_arg3,headers);
          if (iVar3 == 0) {
            curl_mfprintf(_stderr,"lib540: now we do the request again\n");
            iVar3 = loop(1,cm,URL,libtest_arg3,headers);
          }
          lVar5 = 0;
          do {
            curl_multi_remove_handle(cm,*(undefined8 *)((long)eh + lVar5));
            curl_easy_cleanup(*(undefined8 *)((long)eh + lVar5));
            lVar5 = lVar5 + 8;
          } while (lVar5 == 8);
          curl_multi_cleanup(cm);
        }
        curl_global_cleanup();
      }
      curl_slist_free_all(headers);
    }
  }
  return iVar3;
}

Assistant:

int test(char *URL)
{
  CURLM *cm = NULL;
  struct curl_slist *headers = NULL;
  char buffer[246]; /* naively fixed-size */
  int res = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    eh[i] = NULL;

  start_test_timing();

  if(test_argc < 4)
    return 99;

  msnprintf(buffer, sizeof(buffer), "Host: %s", HOST);

  /* now add a custom Host: header */
  headers = curl_slist_append(headers, buffer);
  if(!headers) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(headers);
    return res;
  }

  res_multi_init(cm);
  if(res) {
    curl_global_cleanup();
    curl_slist_free_all(headers);
    return res;
  }

  res = loop(0, cm, URL, PROXYUSERPWD, headers);
  if(res)
    goto test_cleanup;

  fprintf(stderr, "lib540: now we do the request again\n");

  res = loop(1, cm, URL, PROXYUSERPWD, headers);

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(cm, eh[i]);
    curl_easy_cleanup(eh[i]);
  }

  curl_multi_cleanup(cm);
  curl_global_cleanup();

  curl_slist_free_all(headers);

  return res;
}